

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

bool vkt::sr::anon_unknown_0::verifyConstantDerivate
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Vec4 *reference,Vec4 *threshold,Vec4 *scale,Vec4 *bias,
               VerificationLogging logPolicy)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  Vector<float,_4> VVar4;
  int i;
  DataType DVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int z;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float afVar18 [4];
  Vector<float,_2> res_5;
  Vector<float,_2> res;
  Vector<float,_2> res_8;
  Vector<bool,_4> res_4;
  Vector<float,_4> local_238;
  Vec4 *local_220;
  Vector<float,_4> local_218;
  Vec4 *local_200;
  DataType local_1f4;
  TestLog *local_1f0;
  undefined1 local_1e8 [16];
  Vector<float,_3> local_1d0;
  PixelBufferAccess *local_1c0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  ios_base local_140 [272];
  
  local_220 = reference;
  local_200 = threshold;
  local_1f0 = log;
  local_1c0 = errorMask;
  DVar5 = glu::getDataTypeFloatScalars(dataType);
  switch(dataType) {
  case TYPE_FLOAT:
    local_1e8._0_12_ = ZEXT812(1);
    local_1e8._12_4_ = 0;
    break;
  case TYPE_FLOAT_VEC2:
    local_1e8._0_12_ = ZEXT812(0x101);
    local_1e8._12_4_ = 0;
    break;
  case TYPE_FLOAT_VEC3:
    local_1e8._0_12_ = ZEXT812(0x10101);
    local_1e8._12_4_ = 0;
    break;
  default:
    local_1e8 = _DAT_00a98960;
  }
  if (logPolicy == LOG_ALL) {
    local_1b8 = (undefined1  [8])local_1f0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"Expecting ",10);
    if (DVar5 == TYPE_FLOAT_VEC3) {
      local_218.m_data[2] = local_220->m_data[2];
      local_218.m_data._0_8_ = *(undefined8 *)local_220->m_data;
      tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_3> *)&local_218);
    }
    else if (DVar5 == TYPE_FLOAT_VEC2) {
      local_218.m_data._0_8_ = *(undefined8 *)local_220->m_data;
      tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_2> *)&local_218);
    }
    else if (DVar5 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)local_220->m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)&fStack_1b0,local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fStack_1b0," with threshold ",0x10);
    if (DVar5 == TYPE_FLOAT_VEC3) {
      local_218.m_data[2] = local_200->m_data[2];
      local_218.m_data._0_8_ = *(undefined8 *)local_200->m_data;
      tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_3> *)&local_218);
    }
    else if (DVar5 == TYPE_FLOAT_VEC2) {
      local_218.m_data._0_8_ = *(undefined8 *)local_200->m_data;
      tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_2> *)&local_218);
    }
    else if (DVar5 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)local_200->m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)&fStack_1b0,local_200);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  iVar9 = (result->m_size).m_data[1];
  if (iVar9 < 1) {
    iVar8 = 0;
  }
  else {
    local_1e8._0_8_ = local_1e8._0_8_ ^ 0x1010101;
    iVar7 = (result->m_size).m_data[0];
    z = 0;
    iVar8 = 0;
    local_1f4 = DVar5;
    do {
      if (0 < iVar7) {
        iVar9 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1b8,(int)result,iVar9,z);
          auVar14._0_4_ = (float)local_1b8._0_4_ - bias->m_data[0];
          auVar14._4_4_ = (float)local_1b8._4_4_ - bias->m_data[1];
          auVar14._8_4_ = fStack_1b0 - bias->m_data[2];
          auVar14._12_4_ = fStack_1ac - bias->m_data[3];
          local_218.m_data = (float  [4])divps(auVar14,*(undefined1 (*) [16])scale->m_data);
          auVar16._0_4_ = local_220->m_data[0] - local_218.m_data[0];
          auVar16._4_4_ = local_220->m_data[1] - local_218.m_data[1];
          auVar16._8_4_ = local_220->m_data[2] - local_218.m_data[2];
          auVar16._12_4_ = local_220->m_data[3] - local_218.m_data[3];
          uVar3 = CONCAT44(auVar16._4_4_,auVar16._0_4_);
          auVar12._0_8_ = uVar3 ^ 0x8000000080000000;
          auVar12._8_4_ = -auVar16._8_4_;
          auVar12._12_4_ = -auVar16._12_4_;
          auVar12 = maxps(auVar12,auVar16);
          auVar14 = *(undefined1 (*) [16])local_200->m_data;
          auVar13._4_4_ = -(uint)(auVar12._4_4_ <= auVar14._4_4_);
          auVar13._0_4_ = -(uint)(auVar12._0_4_ <= auVar14._0_4_);
          auVar13._8_4_ = -(uint)(auVar12._8_4_ <= auVar14._8_4_);
          auVar13._12_4_ = -(uint)(auVar12._12_4_ <= auVar14._12_4_);
          auVar14 = packssdw(auVar13,auVar13);
          auVar14 = packsswb(auVar14,auVar14);
          local_1b8._0_4_ = auVar14._0_4_ & (uint)DAT_00a98960 | local_1e8._0_4_;
          local_238.m_data[0] = 2.3694278e-38;
          bVar10 = true;
          lVar6 = 0;
          do {
            while (bVar10) {
              pcVar1 = local_1b8 + lVar6;
              cVar2 = *(char *)((long)local_238.m_data + lVar6);
              bVar10 = *pcVar1 == cVar2;
              lVar6 = lVar6 + 1;
              if (lVar6 == 4) {
                if (*pcVar1 == cVar2) goto LAB_0056d504;
                goto LAB_0056d330;
              }
            }
            lVar6 = lVar6 + 1;
            bVar10 = false;
          } while (lVar6 != 4);
LAB_0056d330:
          if (iVar8 < 10 && logPolicy == LOG_ALL) {
            local_1b8 = (undefined1  [8])local_1f0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fStack_1b0,"FAIL: got ",10);
            VVar4.m_data = local_218.m_data;
            if (local_1f4 == TYPE_FLOAT_VEC3) {
              local_238.m_data[2] = local_218.m_data[2];
              local_238.m_data[0] = local_218.m_data[0];
              local_238.m_data[1] = local_218.m_data[1];
              local_218.m_data = VVar4.m_data;
              tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_3> *)&local_238);
            }
            else if (local_1f4 == TYPE_FLOAT_VEC2) {
              local_238.m_data[0] = local_218.m_data[0];
              local_238.m_data[1] = local_218.m_data[1];
              local_218.m_data = VVar4.m_data;
              tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_2> *)&local_238);
            }
            else if (local_1f4 == TYPE_FLOAT) {
              std::ostream::_M_insert<double>((double)local_218.m_data[0]);
            }
            else {
              tcu::operator<<((ostream *)&fStack_1b0,&local_218);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", diff = ",9)
            ;
            auVar15._0_4_ = local_220->m_data[0] - local_218.m_data[0];
            auVar15._4_4_ = local_220->m_data[1] - local_218.m_data[1];
            auVar15._8_4_ = local_220->m_data[2] - local_218.m_data[2];
            auVar15._12_4_ = local_220->m_data[3] - local_218.m_data[3];
            uVar3 = CONCAT44(auVar15._4_4_,auVar15._0_4_);
            auVar17._0_8_ = uVar3 ^ 0x8000000080000000;
            auVar17._8_4_ = -auVar15._8_4_;
            auVar17._12_4_ = -auVar15._12_4_;
            afVar18 = (float  [4])maxps(auVar17,auVar15);
            local_238.m_data._0_8_ = afVar18._0_8_;
            local_238.m_data = afVar18;
            if (local_1f4 == TYPE_FLOAT_VEC3) {
              local_238.m_data[2] = afVar18[2];
              local_1d0.m_data[2] = local_238.m_data[2];
              local_1d0.m_data[0] = local_238.m_data[0];
              local_1d0.m_data[1] = local_238.m_data[1];
              tcu::operator<<((ostream *)&fStack_1b0,&local_1d0);
            }
            else if (local_1f4 == TYPE_FLOAT_VEC2) {
              local_1d0.m_data[0] = local_238.m_data[0];
              local_1d0.m_data[1] = local_238.m_data[1];
              tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_2> *)&local_1d0);
            }
            else if (local_1f4 == TYPE_FLOAT) {
              local_238.m_data[0] = afVar18[0];
              dVar11 = (double)local_238.m_data[0];
              std::ostream::_M_insert<double>(dVar11);
            }
            else {
              tcu::operator<<((ostream *)&fStack_1b0,&local_238);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", at x = ",9)
            ;
            std::ostream::operator<<((ostringstream *)&fStack_1b0,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,", y = ",6);
            std::ostream::operator<<((ostringstream *)&fStack_1b0,z);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
            std::ios_base::~ios_base(local_140);
          }
          iVar8 = iVar8 + 1;
          local_238.m_data[0] = -1.7014636e+38;
          tcu::RGBA::toVec((RGBA *)&local_238);
          tcu::PixelBufferAccess::setPixel(local_1c0,(Vec4 *)local_1b8,iVar9,z,0);
LAB_0056d504:
          iVar9 = iVar9 + 1;
          iVar7 = (result->m_size).m_data[0];
        } while (iVar9 < iVar7);
        iVar9 = (result->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar9);
    if (logPolicy == LOG_ALL && 9 < iVar8) {
      local_1b8 = (undefined1  [8])local_1f0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"...",3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    if (0 < iVar8 && logPolicy == LOG_ALL) {
      local_1b8 = (undefined1  [8])local_1f0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"FAIL: found ",0xc);
      std::ostream::operator<<((ostringstream *)&fStack_1b0,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0," failed pixels",0xe);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
      iVar8 = 1;
    }
  }
  return iVar8 == 0;
}

Assistant:

static bool verifyConstantDerivate (tcu::TestLog&						log,
									const tcu::ConstPixelBufferAccess&	result,
									const tcu::PixelBufferAccess&		errorMask,
									glu::DataType						dataType,
									const tcu::Vec4&					reference,
									const tcu::Vec4&					threshold,
									const tcu::Vec4&					scale,
									const tcu::Vec4&					bias,
									VerificationLogging					logPolicy = LOG_ALL)
{
	const int			numComps		= glu::getDataTypeFloatScalars(dataType);
	const tcu::BVec4	mask			= tcu::logicalNot(getDerivateMask(dataType));
	int					numFailedPixels	= 0;

	if (logPolicy == LOG_ALL)
		log << TestLog::Message << "Expecting " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps) << TestLog::EndMessage;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4		resDerivate		= readDerivate(result, scale, bias, x, y);
			const bool			isOk			= tcu::allEqual(tcu::logicalOr(tcu::lessThanEqual(tcu::abs(reference - resDerivate), threshold), mask), tcu::BVec4(true));

			if (!isOk)
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
					log << TestLog::Message << "FAIL: got " << LogVecComps(resDerivate, numComps)
											<< ", diff = " << LogVecComps(tcu::abs(reference - resDerivate), numComps)
											<< ", at x = " << x << ", y = " << y
						<< TestLog::EndMessage;
				numFailedPixels += 1;
				errorMask.setPixel(tcu::RGBA::red().toVec(), x, y);
			}
		}
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0 && logPolicy == LOG_ALL)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}